

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O1

void anon_unknown.dwarf_167e751::cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  uint *puVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  long *plVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<cmListFileArgument> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string accessString;
  string stack;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> newLFFArgs;
  cmListFileFunction newLFF;
  cmExecutionStatus status;
  undefined1 local_2f1;
  uint *local_2f0;
  char *local_2e8;
  uint local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  pointer local_2d0;
  pointer local_2c8;
  undefined1 local_2c0 [16];
  uint *local_2b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a8;
  uint local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined1 *local_290;
  long *local_288;
  undefined8 local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  undefined8 uStack_270;
  uint *local_268;
  undefined8 local_260;
  uint local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  pointer local_248;
  pointer local_240;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  long local_218 [2];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_208;
  cmMakefile *local_1e8;
  cmListFileFunction local_1e0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_190 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_178;
  char *local_168;
  undefined1 local_160 [24];
  char *pcStack_148;
  size_t local_140;
  char *local_138;
  uint *local_130;
  char *local_128;
  uint local_120 [2];
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 local_110;
  undefined8 local_108;
  uint *local_100;
  undefined8 local_f8;
  uint local_f0 [2];
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  undefined8 local_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  string local_a0;
  undefined8 local_80;
  char *local_78;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_70;
  bool local_50;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_48;
  
  if (*client_data == '\0') {
    *(undefined1 *)client_data = 1;
    psVar4 = cmVariableWatch::GetAccessAsString_abi_cxx11_(access_type);
    local_248 = (pointer)local_238;
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,pcVar2,pcVar2 + psVar4->_M_string_length);
    puVar1 = (uint *)(local_190 + 0x10);
    local_190._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"LISTFILE_STACK","");
    psVar4 = (string *)cmMakefile::GetProperty(mf,(string *)local_190);
    if (psVar4 == (string *)0x0) {
      psVar4 = &cmValue::Empty_abi_cxx11_;
    }
    local_228._M_allocated_capacity = (size_type)local_218;
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_238 + 0x10),pcVar2,pcVar2 + psVar4->_M_string_length);
    if ((uint *)local_190._0_8_ != puVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    if (*(long *)((long)client_data + 0x10) == 0) {
      pcVar2 = (variable->_M_dataplus)._M_p;
      local_190._16_8_ = variable->_M_string_length;
      pcVar6 = "";
      if (newValue != (char *)0x0) {
        pcVar6 = newValue;
      }
      local_190._0_8_ = (cmMakefile *)0xa;
      local_190._8_8_ = "Variable \"";
      aStack_178._0_4_ = SUB84(pcVar2,0);
      aStack_178._4_2_ = (undefined2)((ulong)pcVar2 >> 0x20);
      aStack_178._6_2_ = (undefined2)((ulong)pcVar2 >> 0x30);
      aStack_178._8_4_ = 0x15;
      aStack_178._12_2_ = 0;
      aStack_178._M_local_buf[0xe] = '\0';
      aStack_178._M_local_buf[0xf] = '\0';
      local_168 = "\" was accessed using ";
      local_160._0_8_ = local_240;
      local_160._8_8_ = local_248;
      local_160._16_8_ = (pointer)0xd;
      pcStack_148 = " with value \"";
      local_140 = strlen(pcVar6);
      local_130 = (uint *)&DAT_00000002;
      local_128 = "\".";
      views._M_len = 7;
      views._M_array = (iterator)local_190;
      local_138 = pcVar6;
      cmCatViews_abi_cxx11_(&local_a0,views);
      cmMakefile::IssueMessage(mf,LOG,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_190._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_190,"CMAKE_CURRENT_LIST_FILE","");
      local_290 = (undefined1 *)client_data;
      psVar4 = (string *)cmMakefile::GetDefinition(mf,(string *)local_190);
      if ((uint *)local_190._0_8_ != puVar1) {
        operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
      }
      pcVar2 = (variable->_M_dataplus)._M_p;
      local_2b0 = &local_2a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,pcVar2,pcVar2 + variable->_M_string_length);
      if (local_2b0 == &local_2a0) {
        aStack_178._0_4_ = uStack_298;
        aStack_178._4_2_ = (undefined2)uStack_294;
        aStack_178._6_2_ = (undefined2)((uint)uStack_294 >> 0x10);
        local_190._0_8_ = puVar1;
      }
      else {
        local_190._0_8_ = local_2b0;
      }
      local_190._8_8_ = local_2a8;
      local_2a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2a0 = local_2a0 & 0xffffff00;
      aStack_178._8_4_ = Quoted;
      local_168 = (char *)0x7fffffffffffffff;
      local_2d0 = (pointer)local_2c0;
      local_2b0 = &local_2a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,local_248,
                 (undefined1 *)
                 ((long)&(local_240->_M_dataplus)._M_p + (long)&(local_248->_M_dataplus)._M_p));
      client_data = local_290;
      local_160._0_8_ = local_160 + 0x10;
      if (local_2d0 == (pointer)local_2c0) {
        pcStack_148 = (char *)local_2c0._8_8_;
      }
      else {
        local_160._0_8_ = local_2d0;
      }
      local_160._8_8_ = local_2c8;
      local_2c8 = (pointer)0x0;
      local_2c0[0] = 0;
      local_140 = CONCAT44(local_140._4_4_,1);
      local_138 = (char *)0x7fffffffffffffff;
      pcVar6 = "";
      if (newValue != (char *)0x0) {
        pcVar6 = newValue;
      }
      local_2f0 = &local_2e0;
      local_2d0 = (pointer)local_2c0;
      local_1e8 = mf;
      sVar5 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,pcVar6,pcVar6 + sVar5);
      local_130 = local_120;
      if (local_2f0 == &local_2e0) {
        uStack_118 = uStack_2d8;
        uStack_114 = uStack_2d4;
      }
      else {
        local_130 = local_2f0;
      }
      local_128 = local_2e8;
      local_2e8 = (char *)0x0;
      local_2e0 = local_2e0 & 0xffffff00;
      local_110 = 1;
      local_108 = 0x7fffffffffffffff;
      if (psVar4 == (string *)0x0) {
        psVar4 = &cmValue::Empty_abi_cxx11_;
      }
      pcVar2 = (psVar4->_M_dataplus)._M_p;
      local_2f0 = &local_2e0;
      local_268 = &local_258;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,pcVar2,pcVar2 + psVar4->_M_string_length);
      local_100 = local_f0;
      if (local_268 == &local_258) {
        uStack_e8 = uStack_250;
        uStack_e4 = uStack_24c;
      }
      else {
        local_100 = local_268;
      }
      local_f8 = local_260;
      local_260 = 0;
      local_258 = local_258 & 0xffffff00;
      local_e0 = 1;
      local_d8 = 0x7fffffffffffffff;
      local_288 = (long *)&local_278;
      local_268 = &local_258;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,local_228._M_allocated_capacity,
                 local_228._8_8_ + local_228._M_allocated_capacity);
      plVar8 = &local_c0;
      if (local_288 == (long *)&local_278) {
        uStack_b8 = uStack_270;
        local_d0 = plVar8;
      }
      else {
        local_d0 = local_288;
      }
      local_c8 = local_280;
      local_280 = 0;
      local_278 = 0;
      local_b0 = 1;
      local_a8 = 0x7fffffffffffffff;
      __l._M_len = 5;
      __l._M_array = (iterator)local_190;
      local_288 = (long *)&local_278;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                (&local_208,__l,(allocator_type *)&local_a0);
      lVar7 = -0xf0;
      do {
        if (plVar8 != (long *)plVar8[-2]) {
          operator_delete((long *)plVar8[-2],*plVar8 + 1);
        }
        plVar8 = plVar8 + -6;
        lVar7 = lVar7 + 0x30;
      } while (lVar7 != 0);
      if (local_288 != (long *)&local_278) {
        operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,CONCAT44(uStack_254,local_258) + 1);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,CONCAT44(uStack_2dc,local_2e0) + 1);
      }
      if (local_2d0 != (pointer)local_2c0) {
        operator_delete(local_2d0,CONCAT71(local_2c0._1_7_,local_2c0[0]) + 1);
      }
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,CONCAT44(uStack_29c,local_2a0) + 1);
      }
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,*(long *)((long)client_data + 8),
                 *(long *)((long)client_data + 0x10) + *(long *)((long)client_data + 8));
      local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
      local_1d0._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
      local_190._0_8_ = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_190 + 8),
                 (Implementation **)local_190,
                 (allocator<cmListFileFunction::Implementation> *)&local_2f1,&local_1b0,
                 (long *)&local_a0,(long *)&local_1d0,&local_48);
      local_1e0.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_190._0_8_;
      local_1e0.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      local_190._0_8_ = local_1e8;
      aStack_178._0_4_ = 0x6e6b6e75;
      aStack_178._4_2_ = 0x776f;
      aStack_178._6_2_ = 0x206e;
      aStack_178._8_4_ = 0x6f727265;
      aStack_178._12_2_ = 0x2e72;
      local_190._16_8_ = 0xe;
      aStack_178._M_local_buf[0xe] = '\0';
      local_160._0_8_ = (pointer)0x0;
      local_160._8_8_ = (pointer)0x0;
      local_160._16_8_ = (pointer)0x0;
      local_168 = (char *)((ulong)local_168 & 0xffffffff00000000);
      local_50 = false;
      local_190._8_8_ = &aStack_178;
      bVar3 = cmMakefile::ExecuteCommand
                        (local_1e8,&local_1e0,(cmExecutionStatus *)local_190,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_70);
      if (local_50 == true) {
        local_50 = false;
        if (local_70._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_70._M_value + 0x10)) {
          operator_delete((void *)local_70._M_value._M_dataplus._M_p,local_70._16_8_ + 1);
        }
      }
      if (!bVar3) {
        local_a0.field_2._8_8_ = *(undefined8 *)((long)client_data + 8);
        local_a0.field_2._M_allocated_capacity = *(size_type *)((long)client_data + 0x10);
        local_a0._M_dataplus._M_p = (pointer)0x56;
        local_a0._M_string_length = 0x78fd66;
        local_80 = 2;
        local_78 = "\".";
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_a0;
        cmCatViews_abi_cxx11_(&local_1d0,views_00);
        cmSystemTools::Error(&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._8_8_ != &aStack_178) {
        operator_delete((void *)local_190._8_8_,
                        CONCAT26(aStack_178._6_2_,CONCAT24(aStack_178._4_2_,aStack_178._0_4_)) + 1);
      }
      if (local_1e0.Impl.
          super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e0.Impl.
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_208);
    }
    *(undefined1 *)client_data = 0;
    if ((long *)local_228._M_allocated_capacity != local_218) {
      operator_delete((void *)local_228._M_allocated_capacity,local_218[0] + 1);
    }
    if (local_248 != (pointer)local_238) {
      operator_delete(local_248,(ulong)(local_238._0_8_ + 1));
    }
  }
  return;
}

Assistant:

void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                            int access_type, void* client_data,
                                            const char* newValue,
                                            const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  auto accessString = cmVariableWatch::GetAccessAsString(access_type);

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = *mf->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    cmValue const currentListFile =
      mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    const auto fakeLineNo =
      std::numeric_limits<decltype(cmListFileArgument::Line)>::max();

    std::vector<cmListFileArgument> newLFFArgs{
      { variable, cmListFileArgument::Quoted, fakeLineNo },
      { accessString, cmListFileArgument::Quoted, fakeLineNo },
      { newValue ? newValue : "", cmListFileArgument::Quoted, fakeLineNo },
      { *currentListFile, cmListFileArgument::Quoted, fakeLineNo },
      { stack, cmListFileArgument::Quoted, fakeLineNo }
    };

    cmListFileFunction newLFF{ data->Command, fakeLineNo, fakeLineNo,
                               std::move(newLFFArgs) };
    cmExecutionStatus status(*makefile);
    if (!makefile->ExecuteCommand(newLFF, status)) {
      cmSystemTools::Error(
        cmStrCat("Error in cmake code at\nUnknown:0:\nA command failed "
                 "during the invocation of callback \"",
                 data->Command, "\"."));
    }
  } else {
    makefile->IssueMessage(
      MessageType::LOG,
      cmStrCat("Variable \"", variable, "\" was accessed using ", accessString,
               " with value \"", (newValue ? newValue : ""), "\"."));
  }

  data->InCallback = false;
}